

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Maybe<kj::HttpHeaderId> * __thiscall
kj::HttpHeaderTable::stringToId
          (Maybe<kj::HttpHeaderId> *__return_storage_ptr__,HttpHeaderTable *this,StringPtr name)

{
  uint uVar1;
  IdsByNameMap *pIVar2;
  size_type __bkt;
  __node_ptr p_Var3;
  char *__c;
  long lVar4;
  ulong uVar5;
  
  __c = name.content.ptr;
  pIVar2 = (this->idsByName).ptr;
  __bkt = (pIVar2->map)._M_h._M_bucket_count;
  if (__c + (name.content.size_ - 1) == __c) {
    uVar5 = 0x1505;
  }
  else {
    uVar5 = 0x1505;
    lVar4 = 0;
    do {
      uVar5 = (ulong)((byte)__c[lVar4] & 0xffffffdf) ^ uVar5 * 0x21;
      lVar4 = lVar4 + 1;
    } while (name.content.size_ - 1 != lVar4);
  }
  p_Var3 = std::
           _Hashtable<kj::StringPtr,_std::pair<const_kj::StringPtr,_unsigned_int>,_std::allocator<std::pair<const_kj::StringPtr,_unsigned_int>_>,_std::__detail::_Select1st,_kj::(anonymous_namespace)::HeaderNameHash,_kj::(anonymous_namespace)::HeaderNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node((_Hashtable<kj::StringPtr,_std::pair<const_kj::StringPtr,_unsigned_int>,_std::allocator<std::pair<const_kj::StringPtr,_unsigned_int>_>,_std::__detail::_Select1st,_kj::(anonymous_namespace)::HeaderNameHash,_kj::(anonymous_namespace)::HeaderNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)(pIVar2->map)._M_h._M_buckets,__bkt,(key_type *)(uVar5 % __bkt),
                          (__hash_code)__c);
  if (p_Var3 != (__node_ptr)0x0) {
    uVar1 = *(uint *)((long)&(p_Var3->
                             super__Hash_node_value<std::pair<const_kj::StringPtr,_unsigned_int>,_true>
                             ).
                             super__Hash_node_value_base<std::pair<const_kj::StringPtr,_unsigned_int>_>
                             ._M_storage._M_storage + 0x10);
    (__return_storage_ptr__->ptr).field_1.value.table = this;
    (__return_storage_ptr__->ptr).field_1.value.id = uVar1;
  }
  (__return_storage_ptr__->ptr).isSet = p_Var3 != (__node_ptr)0x0;
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<HttpHeaderId> HttpHeaderTable::stringToId(kj::StringPtr name) const {
  auto iter = idsByName->map.find(name);
  if (iter == idsByName->map.end()) {
    return kj::none;
  } else {
    return HttpHeaderId(this, iter->second);
  }
}